

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef CompileLlvmDoWhile(LlvmCompilationContext *ctx,ExprDoWhile *node)

{
  uint uVar1;
  LoopInfo *pLVar2;
  ExpressionContext *pEVar3;
  long lVar4;
  TypeBase *type;
  
  uVar1 = (ctx->loopInfo).count;
  if (uVar1 == (ctx->loopInfo).max) {
    SmallArray<LlvmCompilationContext::LoopInfo,_32U>::grow(&ctx->loopInfo,uVar1);
  }
  pLVar2 = (ctx->loopInfo).data;
  if (pLVar2 == (LoopInfo *)0x0) {
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x162,
                  "void SmallArray<LlvmCompilationContext::LoopInfo, 32>::push_back(const T &) [T = LlvmCompilationContext::LoopInfo, N = 32]"
                 );
  }
  uVar1 = (ctx->loopInfo).count;
  (ctx->loopInfo).count = uVar1 + 1;
  pLVar2[uVar1].breakBlock = (LLVMBasicBlockRef)&placeholderBasicBlock;
  pLVar2[uVar1].continueBlock = (LLVMBasicBlockRef)&placeholderBasicBlock;
  CompileLlvm(ctx,node->body);
  CompileLlvm(ctx,node->condition);
  type = node->condition->type;
  pEVar3 = ctx->ctx;
  lVar4 = 0x89d8;
  if (((pEVar3->typeBool != type) && (pEVar3->typeChar != type)) && (pEVar3->typeShort != type)) {
    if (pEVar3->typeFloat != type) goto LAB_0026d9a6;
    lVar4 = 0x89f0;
  }
  type = *(TypeBase **)((long)(pEVar3->uniqueDependencies).little + lVar4 + -0x30);
LAB_0026d9a6:
  CompileLlvmType(ctx,type);
  uVar1 = (ctx->loopInfo).count;
  if (uVar1 == 0) {
    __assert_fail("count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x183,
                  "void SmallArray<LlvmCompilationContext::LoopInfo, 32>::pop_back() [T = LlvmCompilationContext::LoopInfo, N = 32]"
                 );
  }
  (ctx->loopInfo).count = uVar1 - 1;
  if ((node->super_ExprBase).type == ctx->ctx->typeVoid) {
    return (LLVMValueRef)0x0;
  }
  __assert_fail("node->type == ctx.ctx.typeVoid",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x27b,"LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)")
  ;
}

Assistant:

LLVMValueRef CompileLlvmDoWhile(LlvmCompilationContext &ctx, ExprDoWhile *node)
{
	LLVMBasicBlockRef bodyBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "do_body");
	LLVMBasicBlockRef condBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "do_cond");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "do_exit");

	LLVMBuildBr(ctx.builder, bodyBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, bodyBlock);

	ctx.loopInfo.push_back(LlvmCompilationContext::LoopInfo(exitBlock, condBlock));

	CompileLlvm(ctx, node->body);

	LLVMBuildBr(ctx.builder, condBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, condBlock);

	LLVMValueRef condition = CompileLlvm(ctx, node->condition);

	condition = LLVMBuildICmp(ctx.builder, LLVMIntNE, condition, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->condition->type)), 0, true), "");

	LLVMBuildCondBr(ctx.builder, condition, bodyBlock, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	ctx.loopInfo.pop_back();

	return CheckType(ctx, node, NULL);
}